

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  uint uVar1;
  long lVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar3;
  appender aVar4;
  int iVar5;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_t sVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  int iVar10;
  uint uVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined8 uVar14;
  char cVar15;
  sign_t sVar16;
  int iVar17;
  uint uVar18;
  float_specs fVar19;
  int iVar20;
  ulong uVar21;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ad0ecca5 write;
  digit_grouping<char> grouping;
  undefined1 local_ff [2];
  undefined4 local_fd;
  int local_f8;
  undefined1 local_f4 [12];
  long local_e8;
  decimal_fp<float> *local_e0;
  int local_d4;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  float_specs *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char *local_90;
  void *local_88;
  format_specs<char> *local_80;
  float_specs local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  uVar18 = f->significand;
  uVar11 = 0x1f;
  if ((uVar18 | 1) != 0) {
    for (; (uVar18 | 1) >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  uVar13 = (ulong)uVar18 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar11 * 8);
  uVar21 = uVar13 >> 0x20;
  iVar5 = (int)(uVar13 >> 0x20);
  local_fd._0_1_ = '0';
  sVar16 = fspecs._5_1_;
  local_ff[1] = sVar16;
  local_f8 = iVar5;
  local_f4._0_4_ = uVar18;
  local_78 = fspecs;
  if (-1 < (long)uVar13) {
    lVar6 = (uVar21 + 1) - (ulong)(sVar16 == none);
    local_ff[0] = '.';
    uVar11 = fspecs._4_4_;
    fVar19 = fspecs;
    if ((uVar11 >> 0x11 & 1) != 0) {
      local_f4._4_8_ = fspecs;
      local_e8 = lVar6;
      local_88 = loc.locale_;
      local_80 = specs;
      local_ff[0] = decimal_point_impl<char>(loc);
      lVar6 = local_e8;
      specs = local_80;
      loc.locale_ = local_88;
      fVar19 = (float_specs)local_f4._4_8_;
    }
    uVar12 = local_c0._M_allocated_capacity;
    uVar1 = f->exponent;
    iVar10 = uVar1 + iVar5;
    iVar17 = fVar19.precision;
    if (fspecs._4_1_ == '\x01') {
LAB_0015f3a3:
      iVar20 = uVar1 + iVar5 + -1;
      if ((uVar11 >> 0x13 & 1) == 0) {
        uVar13 = 0;
        if (iVar5 == 1) {
          local_ff[0] = '\0';
          uVar13 = 0;
        }
      }
      else {
        uVar13 = 0;
        if (0 < iVar17 - iVar5) {
          uVar13 = (ulong)(uint)(iVar17 - iVar5);
        }
        lVar6 = lVar6 + uVar13;
      }
      local_d0[0] = sVar16;
      local_d0._4_4_ = uVar18;
      local_d0[0xc] = local_ff[0];
      local_d0._8_4_ = iVar5;
      local_c0._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar13);
      local_c0._M_allocated_capacity._6_2_ = SUB82(uVar12,6);
      local_c0._M_allocated_capacity =
           CONCAT26(local_c0._M_allocated_capacity._6_2_,
                    CONCAT15(((uVar11 >> 0x10 & 1) == 0) << 5,local_c0._M_allocated_capacity._0_5_))
           | 0x450000000000;
      local_c0._8_4_ = iVar20;
      if (0 < specs->width) {
        if (iVar10 < 1) {
          iVar20 = 1 - iVar10;
        }
        lVar2 = 2;
        if (99 < iVar20) {
          lVar2 = (ulong)(999 < iVar20) + 3;
        }
        sVar8 = lVar6 + (3 - (ulong)(local_ff[0] == '\0')) + lVar2;
        aVar4 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                          (out,specs,sVar8,sVar8,(anon_class_28_8_ad0ecca5 *)local_d0);
        return (appender)
               aVar4.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      aVar4 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
              ::anon_class_28_8_ad0ecca5::operator()
                        ((anon_class_28_8_ad0ecca5 *)local_d0,
                         (iterator)
                         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      return (appender)
             aVar4.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if (((ulong)fspecs & 0xff00000000) == 0) {
      iVar20 = 0x10;
      if (0 < iVar17) {
        iVar20 = iVar17;
      }
      if ((iVar10 < -3) || (iVar20 < iVar10)) goto LAB_0015f3a3;
    }
    local_d4 = iVar10;
    if ((int)uVar1 < 0) {
      if (iVar10 < 1) {
        iVar20 = -iVar10;
        iVar5 = iVar20;
        if (SBORROW4(iVar17,iVar20) != iVar17 + iVar10 < 0) {
          iVar5 = iVar17;
        }
        if (iVar17 < 0) {
          iVar5 = iVar20;
        }
        if (uVar21 != 0) {
          iVar5 = iVar20;
        }
        local_70._M_allocated_capacity._0_4_ = iVar5;
        if (iVar5 == 0 && uVar21 == 0) {
          local_fd._1_1_ = (char)((uVar11 & 0x80000) >> 0x13);
          iVar10 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
        }
        else {
          local_fd._1_1_ = 1;
          iVar10 = 2;
          if (iVar5 < 0) goto LAB_0015f6b3;
        }
        sVar8 = lVar6 + (ulong)(uint)(iVar10 + iVar5);
        local_d0._0_8_ = local_ff + 1;
        local_d0._8_8_ = local_ff + 2;
        local_c0._M_allocated_capacity = (long)&local_fd + 1;
        local_c0._8_8_ = local_ff;
        local_b0._M_p = (pointer)&local_70;
        local_a8 = (float_specs *)local_f4;
        local_a0._M_allocated_capacity = (size_type)&local_f8;
        aVar4 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                          (out,specs,sVar8,sVar8,(anon_class_56_7_162c6e41 *)local_d0);
        return (appender)
               aVar4.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      iVar20 = 0;
      register0x000000b0 = iVar17 - iVar5 & (int)(uVar11 << 0xc) >> 0x1f;
      uVar18 = register0x000000b0;
      if ((int)register0x000000b0 < 1) {
        uVar18 = 0;
      }
      local_f4._4_8_ = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      local_e8 = lVar6;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_d0,loc,(bool)((byte)(uVar11 >> 0x11) & 1));
      if (local_a8 != (float_specs *)0x0) {
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_d0._8_8_ + local_d0._0_8_);
        lVar6 = 0;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d0._0_8_;
        do {
          if (paVar9 == paVar7) {
            cVar15 = paVar7->_M_local_buf[-1];
            paVar9 = paVar7;
          }
          else {
            cVar15 = paVar9->_M_local_buf[0];
            if ((byte)(cVar15 + 0x81U) < 0x82) goto LAB_0015f6da;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar9->_M_local_buf + 1);
          }
          iVar20 = iVar20 + cVar15;
          if (iVar10 <= iVar20) goto LAB_0015f6da;
          lVar6 = lVar6 + 1;
        } while( true );
      }
      lVar6 = 0;
LAB_0015f6da:
      sVar8 = (ulong)uVar18 + local_e8 + lVar6 + 1;
      local_70._M_allocated_capacity = (size_type)(local_ff + 1);
      local_70._8_8_ = local_f4;
      local_60._M_allocated_capacity = (size_type)&local_f8;
      local_60._8_8_ = &local_d4;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_ff;
      local_40._M_allocated_capacity = (long)&local_fd + 1;
      local_40._8_8_ = local_ff + 2;
      local_48 = (digit_grouping<char> *)local_d0;
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     ((appender)local_f4._4_8_,specs,sVar8,sVar8,
                      (anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_p != &local_a0) {
        operator_delete(local_b0._M_p,(ulong)(local_a0._M_allocated_capacity + 1));
      }
      uVar12 = local_c0._M_allocated_capacity;
      uVar14 = local_d0._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d0 + 0x10)) {
        return (appender)bVar3.container;
      }
    }
    else {
      lVar6 = lVar6 + (ulong)uVar1;
      register0x000000b0 = iVar17 - iVar10;
      if ((uVar11 >> 0x13 & 1) != 0) {
        lVar6 = lVar6 + 1;
        if (fspecs._4_1_ == '\x02' || 0 < (int)register0x000000b0) {
          if (0 < (int)register0x000000b0) {
            lVar6 = lVar6 + (ulong)(uint)register0x000000b0;
          }
        }
        else {
          stack0xffffffffffffff04 = 0;
        }
      }
      local_e0 = f;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar11 >> 0x11) & 1));
      iVar5 = 0;
      if (local_48 != (digit_grouping<char> *)0x0) {
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_70._8_8_ + local_70._M_allocated_capacity);
        lVar2 = 0;
        uVar12 = local_70._M_allocated_capacity;
        do {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar12 == paVar9) {
            cVar15 = paVar9->_M_local_buf[-1];
            uVar12 = paVar9;
          }
          else {
            cVar15 = *(char *)uVar12;
            if ((byte)(cVar15 + 0x81U) < 0x82) goto LAB_0015f5c9;
            uVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar12 + 1);
          }
          iVar5 = iVar5 + cVar15;
          if (iVar10 <= iVar5) goto LAB_0015f5c9;
          lVar2 = lVar2 + 1;
        } while( true );
      }
      lVar2 = 0;
LAB_0015f5c9:
      local_d0._0_8_ = local_ff + 1;
      local_d0._8_8_ = local_f4;
      local_c0._M_allocated_capacity = (size_type)&local_f8;
      local_c0._8_8_ = local_e0;
      local_a8 = &local_78;
      local_a0._M_allocated_capacity = (size_type)local_ff;
      local_a0._8_8_ = (long)&local_fd + 1;
      local_90 = local_ff + 2;
      local_b0._M_p = (pointer)&local_70;
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (out,specs,lVar6 + lVar2,lVar6 + lVar2,(anon_class_72_9_0c6a3a8a *)local_d0);
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40._M_allocated_capacity + 1);
      }
      uVar12 = local_60._M_allocated_capacity;
      uVar14 = local_70._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_allocated_capacity == &local_60) {
        return (appender)bVar3.container;
      }
    }
    operator_delete((void *)uVar14,uVar12 + 1);
    return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar3.container;
  }
LAB_0015f6b3:
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
              ,0x17a,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}